

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  MemPool *pMVar1;
  byte bVar2;
  int iVar3;
  byte *p_00;
  XMLAttribute *this_00;
  char *pcVar4;
  XMLAttribute *pXVar5;
  XMLAttribute **ppXVar6;
  undefined4 extraout_var;
  XMLAttribute *pXVar7;
  XMLError error;
  XMLDocument *pXVar8;
  
  if (p != (char *)0x0) {
    p_00 = (byte *)XMLUtil::SkipWhiteSpace(p,curLineNumPtr);
    bVar2 = *p_00;
    if (bVar2 != 0) {
      pXVar7 = (XMLAttribute *)0x0;
      do {
        if (-1 < (char)bVar2) {
          iVar3 = isalpha((uint)bVar2);
          if (iVar3 == 0) {
            if (bVar2 < 0x3e) {
              if (bVar2 != 0x3a) {
                if ((bVar2 == 0x2f) && (p_00[1] == 0x3e)) {
                  this->_closingType = CLOSED;
                  return (char *)(p_00 + 2);
                }
LAB_001080c1:
                pXVar8 = (this->super_XMLNode)._document;
                iVar3 = (this->super_XMLNode)._parseLineNum;
                error = XML_ERROR_PARSING_ELEMENT;
                goto LAB_00108017;
              }
            }
            else if (bVar2 != 0x5f) {
              if (bVar2 == 0x3e) {
                return (char *)(p_00 + 1);
              }
              goto LAB_001080c1;
            }
          }
        }
        this_00 = (XMLAttribute *)
                  MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
        this_00->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00115980;
        (this_00->_name)._flags = 0;
        (this_00->_name)._start = (char *)0x0;
        (this_00->_name)._end = (char *)0x0;
        (this_00->_value)._flags = 0;
        (this_00->_value)._start = (char *)0x0;
        (this_00->_value)._end = (char *)0x0;
        this_00->_parseLineNum = 0;
        this_00->_next = (XMLAttribute *)0x0;
        this_00->_memPool = (MemPool *)0x0;
        pXVar8 = (this->super_XMLNode)._document;
        this_00->_memPool = &(pXVar8->_attributePool).super_MemPool;
        (*(pXVar8->_attributePool).super_MemPool._vptr_MemPool[5])();
        pXVar8 = (this->super_XMLNode)._document;
        iVar3 = pXVar8->_parseCurLineNum;
        this_00->_parseLineNum = iVar3;
        p_00 = (byte *)XMLAttribute::ParseDeep
                                 (this_00,(char *)p_00,pXVar8->_processEntities,curLineNumPtr);
        if (p_00 == (byte *)0x0) {
          pMVar1 = this_00->_memPool;
          (**this_00->_vptr_XMLAttribute)(this_00);
          (*pMVar1->_vptr_MemPool[4])(pMVar1,this_00);
          XMLDocument::SetError
                    ((this->super_XMLNode)._document,XML_ERROR_PARSING_ATTRIBUTE,p,(char *)0x0,iVar3
                    );
          return (char *)0x0;
        }
        pcVar4 = StrPair::GetStr(&this_00->_name);
        pXVar5 = FindAttribute(this,pcVar4);
        if ((pXVar5 != (XMLAttribute *)0x0) &&
           (pcVar4 = StrPair::GetStr(&pXVar5->_value), pcVar4 != (char *)0x0)) {
          pMVar1 = this_00->_memPool;
          (**this_00->_vptr_XMLAttribute)(this_00);
          (*pMVar1->_vptr_MemPool[4])(pMVar1,this_00);
          pXVar8 = (this->super_XMLNode)._document;
          error = XML_ERROR_PARSING_ATTRIBUTE;
          goto LAB_00108017;
        }
        ppXVar6 = &pXVar7->_next;
        if (pXVar7 == (XMLAttribute *)0x0) {
          ppXVar6 = &this->_rootAttribute;
        }
        *ppXVar6 = this_00;
        p_00 = (byte *)XMLUtil::SkipWhiteSpace((char *)p_00,curLineNumPtr);
        bVar2 = *p_00;
        pXVar7 = this_00;
      } while (bVar2 != 0);
    }
    pXVar8 = (this->super_XMLNode)._document;
    iVar3 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      p_00 = (byte *)StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      p_00 = (byte *)0x0;
    }
    iVar3 = (this->super_XMLNode)._parseLineNum;
    error = XML_ERROR_PARSING_ELEMENT;
LAB_00108017:
    XMLDocument::SetError(pXVar8,error,p,(char *)p_00,iVar3);
  }
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name(), _parseLineNum );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p, attrLineNum );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p, _parseLineNum );
            return 0;
        }
    }
    return p;
}